

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetFieldOverride(ON_DimStyle *this,field field_id,bool bOverrideParent)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  ON__UINT32 *pOVar4;
  uint uVar5;
  ON__UINT32 mask;
  undefined8 uStack_18;
  
  if ((field_id - ExtensionLineExtension < 0x70) &&
     (this->m_field_override_parent_count != 0 || bOverrideParent)) {
    uStack_18 = (ulong)(field_id - ExtensionLineExtension);
    pOVar4 = Internal_GetOverrideParentBit(this,field_id,(ON__UINT32 *)((long)&uStack_18 + 4));
    if (pOVar4 != (ON__UINT32 *)0x0) {
      uVar1 = *pOVar4;
      if (bOverrideParent) {
        uVar5 = uStack_18._4_4_ | uVar1;
        *pOVar4 = uVar5;
        iVar3 = 1;
      }
      else {
        uVar5 = ~uStack_18._4_4_ & uVar1;
        *pOVar4 = uVar5;
        iVar3 = -1;
      }
      if (uVar5 != uVar1) {
        this->m_field_override_parent_count = this->m_field_override_parent_count + iVar3;
        ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
        *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
             ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
        uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
        *(undefined8 *)(this->m_content_hash).m_digest =
             ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
        *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar2;
      }
    }
  }
  return;
}

Assistant:

void ON_DimStyle::SetFieldOverride(ON_DimStyle::field field_id, bool bOverrideParent)
{
  // Note well:
  //   The Name and Index properties cannot be inherited from a parent dimension style.
  if (
    static_cast<unsigned int>(field_id) > static_cast<unsigned int>(ON_DimStyle::field::Index)
    && static_cast<unsigned int>(field_id) < static_cast<unsigned int>(ON_DimStyle::field::Count)
    && (m_field_override_parent_count > 0 || bOverrideParent)
    )
  {
    ON__UINT32 mask = 0;
    ON__UINT32* bits = Internal_GetOverrideParentBit(field_id, &mask);
    if (nullptr != bits)
    {
      const ON__UINT32 bits0 = *bits;
      if (bOverrideParent)
      {
        // field_id bit = 1 indicates the field value is independent of the parent.
        *bits |= mask;
        if (*bits != bits0)
        {
          m_field_override_parent_count++;
          Internal_ContentChange();
        }
      }
      else
      {
        // field_id bit = 0 indicates the field value is inherited from the parent.
        *bits &= ~mask;
        if (*bits != bits0)
        {
          m_field_override_parent_count--;
          Internal_ContentChange();
        }
      }
    }
  }
}